

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O1

void andnot_test(void)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  ulong uVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  bitset_container_t *src_1;
  bitset_container_t *src_2;
  bitset_container_t *bitset;
  bitset_container_t *dst;
  int index;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  src_1 = bitset_container_create();
  src_2 = bitset_container_create();
  bitset = bitset_container_create();
  dst = bitset_container_create();
  _assert_true((unsigned_long)src_1,"B1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xec);
  _assert_true((unsigned_long)src_2,"B2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xed);
  _assert_true((unsigned_long)bitset,"BI",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xee);
  _assert_true((unsigned_long)dst,"TMP",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xef);
  puVar1 = src_1->words;
  puVar2 = bitset->words;
  uVar8 = 0xfffffffffffffffd;
  do {
    uVar8 = uVar8 + 3;
    uVar9 = uVar8 >> 6;
    uVar3 = puVar1[uVar9];
    uVar10 = uVar3 | 1L << (uVar8 & 0x3f);
    src_1->cardinality = src_1->cardinality + (int)((uVar3 ^ uVar10) >> ((byte)uVar8 & 0x3f));
    puVar1[uVar9] = uVar10;
    uVar3 = puVar2[uVar9];
    uVar10 = uVar3 | 1L << (uVar8 & 0x3f);
    bitset->cardinality = bitset->cardinality + (int)((uVar3 ^ uVar10) >> ((byte)uVar8 & 0x3f));
    puVar2[uVar9] = uVar10;
  } while (uVar8 < 0xfffd);
  puVar1 = src_2->words;
  puVar2 = bitset->words;
  uVar8 = 0xffffffffffffffc2;
  do {
    uVar8 = uVar8 + 0x3e;
    uVar9 = uVar8 >> 6;
    uVar3 = puVar1[uVar9];
    uVar7 = (uint)uVar8 & 0x3e;
    uVar10 = uVar3 | 1L << uVar7;
    src_2->cardinality = src_2->cardinality + (int)((uVar3 ^ uVar10) >> (sbyte)uVar7);
    puVar1[uVar9] = uVar10;
    uVar3 = puVar2[uVar9];
    bitset->cardinality = bitset->cardinality - (uint)((uVar3 >> uVar7 & 1) != 0);
    puVar2[uVar9] = uVar3 & ~(1L << uVar7);
  } while (uVar8 < 0xffc2);
  iVar5 = bitset_container_compute_cardinality(bitset);
  bitset_container_andnot_nocard(src_1,src_2,dst);
  iVar6 = bitset_container_compute_cardinality(dst);
  _assert_int_equal((long)iVar5,(long)iVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                    ,0x100);
  _Var4 = bitset_container_equals(bitset,dst);
  _assert_true((ulong)_Var4,"bitset_container_equals(BI, TMP)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x101);
  iVar6 = bitset_container_andnot(src_1,src_2,dst);
  _assert_int_equal((long)iVar5,(long)iVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                    ,0x103);
  _Var4 = bitset_container_equals(bitset,dst);
  _assert_true((ulong)_Var4,"bitset_container_equals(BI, TMP)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x104);
  bitset_container_free(src_1);
  bitset_container_free(src_2);
  bitset_container_free(bitset);
  bitset_container_free(dst);
  return;
}

Assistant:

DEFINE_TEST(andnot_test) {
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* BI = bitset_container_create();
    bitset_container_t* TMP = bitset_container_create();

    assert_non_null(B1);
    assert_non_null(B2);
    assert_non_null(BI);
    assert_non_null(TMP);

    for (size_t x = 0; x < (1 << 16); x += 3) {
        bitset_container_set(B1, x);
        bitset_container_set(BI, x);
    }

    // important: 62 is not divisible by 3
    for (size_t x = 0; x < (1 << 16); x += 62) {
        bitset_container_set(B2, x);
        bitset_container_remove(BI, x);
    }

    const int expected = bitset_container_compute_cardinality(BI);

    bitset_container_andnot_nocard(B1, B2, TMP);

    assert_int_equal(expected, bitset_container_compute_cardinality(TMP));
    assert_true(bitset_container_equals(BI, TMP));

    assert_int_equal(expected, bitset_container_andnot(B1, B2, TMP));
    assert_true(bitset_container_equals(BI, TMP));

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(BI);
    bitset_container_free(TMP);
}